

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pTextureCountTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Performance::TextureCountTests::init(TextureCountTests *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  float *pfVar2;
  Context *context;
  long *plVar3;
  undefined8 *puVar4;
  char *__s;
  Texture2DRenderCase *this_00;
  long lVar5;
  size_type *psVar6;
  long *plVar7;
  undefined8 uVar8;
  ulong uVar9;
  int row;
  long lVar10;
  long lVar11;
  ostringstream *this_01;
  undefined4 uVar12;
  allocator<char> local_259;
  deUint32 local_258;
  deUint32 local_254;
  string description;
  string name;
  ulong *local_210;
  long local_208;
  ulong local_200 [2];
  TestNode *local_1f0;
  ulong local_1e8;
  long *local_1e0 [2];
  long local_1d0 [2];
  long local_1c0;
  char *local_1b8;
  long local_1b0;
  Mat3 local_1a8 [3];
  ios_base local_138 [264];
  
  paVar1 = &description.field_2;
  pfVar2 = local_1a8[0].m_data.m_data[1].m_data + 1;
  local_1c0 = 0;
  local_1f0 = (TestNode *)this;
  do {
    local_254 = init::texFormats[local_1c0].format;
    local_258 = init::texFormats[local_1c0].dataType;
    local_1b8 = init::texFormats[local_1c0].name;
    local_1b0 = 0;
    do {
      this_01 = (ostringstream *)local_1a8;
      local_1e8 = (ulong)(uint)addShaderCompilationPerformanceCases(deqp::gles2::TestCaseGroup&)::
                               texLookupCounts[local_1b0];
      std::__cxx11::string::string<std::allocator<char>>((string *)local_1e0,local_1b8,&local_259);
      plVar3 = (long *)std::__cxx11::string::append((char *)local_1e0);
      psVar6 = (size_type *)(plVar3 + 2);
      if ((size_type *)*plVar3 == psVar6) {
        description.field_2._M_allocated_capacity = *psVar6;
        description.field_2._8_8_ = plVar3[3];
        description._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        description.field_2._M_allocated_capacity = *psVar6;
        description._M_dataplus._M_p = (pointer)*plVar3;
      }
      description._M_string_length = plVar3[1];
      *plVar3 = (long)psVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream(this_01);
      std::ostream::operator<<(this_01,(int)local_1e8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(this_01);
      std::ios_base::~ios_base(local_138);
      uVar8 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)description._M_dataplus._M_p != paVar1) {
        uVar8 = description.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar8 < local_208 + description._M_string_length) {
        uVar9 = 0xf;
        if (local_210 != local_200) {
          uVar9 = local_200[0];
        }
        if (uVar9 < local_208 + description._M_string_length) goto LAB_0101466f;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_210,0,(char *)0x0,(ulong)description._M_dataplus._M_p);
      }
      else {
LAB_0101466f:
        puVar4 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&description,(ulong)local_210);
      }
      name._M_dataplus._M_p = (pointer)&name.field_2;
      psVar6 = puVar4 + 2;
      if ((size_type *)*puVar4 == psVar6) {
        name.field_2._M_allocated_capacity = *psVar6;
        name.field_2._8_8_ = puVar4[3];
      }
      else {
        name.field_2._M_allocated_capacity = *psVar6;
        name._M_dataplus._M_p = (pointer)*puVar4;
      }
      name._M_string_length = puVar4[1];
      *puVar4 = psVar6;
      puVar4[1] = 0;
      *(char *)psVar6 = '\0';
      if (local_210 != local_200) {
        operator_delete(local_210,local_200[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)description._M_dataplus._M_p != paVar1) {
        operator_delete(description._M_dataplus._M_p,description.field_2._M_allocated_capacity + 1);
      }
      if (local_1e0[0] != local_1d0) {
        operator_delete(local_1e0[0],local_1d0[0] + 1);
      }
      __s = glu::getTextureFormatName(local_254);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1e0,__s,(allocator<char> *)&local_210);
      plVar3 = (long *)std::__cxx11::string::append((char *)local_1e0);
      plVar7 = plVar3 + 2;
      if ((float *)*plVar3 == (float *)plVar7) {
        local_1a8[0].m_data.m_data[1].m_data._4_8_ = *plVar7;
        local_1a8[0].m_data.m_data[2].m_data._0_8_ = plVar3[3];
        local_1a8[0].m_data.m_data[0].m_data._0_8_ = pfVar2;
      }
      else {
        local_1a8[0].m_data.m_data[1].m_data._4_8_ = *plVar7;
        local_1a8[0].m_data.m_data[0].m_data._0_8_ = (float *)*plVar3;
      }
      local_1a8[0].m_data.m_data._8_8_ = plVar3[1];
      *plVar3 = (long)plVar7;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      glu::getTypeName(local_258);
      plVar3 = (long *)std::__cxx11::string::append((char *)this_01);
      psVar6 = (size_type *)(plVar3 + 2);
      if ((size_type *)*plVar3 == psVar6) {
        description.field_2._M_allocated_capacity = *psVar6;
        description.field_2._8_8_ = plVar3[3];
        description._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        description.field_2._M_allocated_capacity = *psVar6;
        description._M_dataplus._M_p = (pointer)*plVar3;
      }
      description._M_string_length = plVar3[1];
      *plVar3 = (long)psVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if ((float *)local_1a8[0].m_data.m_data[0].m_data._0_8_ != pfVar2) {
        operator_delete((void *)local_1a8[0].m_data.m_data[0].m_data._0_8_,
                        local_1a8[0].m_data.m_data[1].m_data._4_8_ + 1);
      }
      if (local_1e0[0] != local_1d0) {
        operator_delete(local_1e0[0],local_1d0[0] + 1);
      }
      this_00 = (Texture2DRenderCase *)operator_new(0x220);
      context = (Context *)local_1f0[1]._vptr_TestNode;
      local_1a8[0].m_data.m_data[1].m_data[1] = 0.0;
      local_1a8[0].m_data.m_data[1].m_data[2] = 0.0;
      local_1a8[0].m_data.m_data[2].m_data[0] = 0.0;
      local_1a8[0].m_data.m_data[2].m_data[1] = 0.0;
      local_1a8[0].m_data.m_data[0].m_data[0] = 0.0;
      local_1a8[0].m_data.m_data[0].m_data[1] = 0.0;
      local_1a8[0].m_data.m_data[0].m_data[2] = 0.0;
      local_1a8[0].m_data.m_data[1].m_data[0] = 0.0;
      local_1a8[0].m_data.m_data[2].m_data[2] = 0.0;
      lVar5 = 0;
      lVar10 = 0;
      do {
        lVar11 = 0;
        do {
          uVar12 = 0x3f800000;
          if (lVar5 != lVar11) {
            uVar12 = 0;
          }
          *(undefined4 *)(this_01 + lVar11) = uVar12;
          lVar11 = lVar11 + 0xc;
        } while (lVar11 != 0x24);
        lVar10 = lVar10 + 1;
        this_01 = this_01 + 4;
        lVar5 = lVar5 + 0xc;
      } while (lVar10 != 3);
      Texture2DRenderCase::Texture2DRenderCase
                (this_00,context,name._M_dataplus._M_p,description._M_dataplus._M_p,local_254,
                 local_258,0x812f,0x812f,0x2600,0x2600,local_1a8,(int)local_1e8,false);
      tcu::TestNode::addChild(local_1f0,(TestNode *)this_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)description._M_dataplus._M_p != paVar1) {
        operator_delete(description._M_dataplus._M_p,description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      local_1b0 = local_1b0 + 1;
    } while (local_1b0 != 4);
    local_1c0 = local_1c0 + 1;
    if (local_1c0 == 4) {
      return 4;
    }
  } while( true );
}

Assistant:

void TextureCountTests::init (void)
{
	static const struct
	{
		const char*	name;
		deUint32	format;
		deUint32	dataType;
	} texFormats[] =
	{
		{ "a8",			GL_ALPHA,			GL_UNSIGNED_BYTE },
		{ "rgb565",		GL_RGB,				GL_UNSIGNED_SHORT_5_6_5 },
		{ "rgb888",		GL_RGB,				GL_UNSIGNED_BYTE },
		{ "rgba8888",	GL_RGBA,			GL_UNSIGNED_BYTE }
	};
	static const int texCounts[] = { 1, 2, 4, 8 };

	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(texFormats); formatNdx++)
	{
		for (int cntNdx = 0; cntNdx < DE_LENGTH_OF_ARRAY(texCounts); cntNdx++)
		{
			deUint32	format			= texFormats[formatNdx].format;
			deUint32	dataType		= texFormats[formatNdx].dataType;
			deUint32	wrapS			= GL_CLAMP_TO_EDGE;
			deUint32	wrapT			= GL_CLAMP_TO_EDGE;
			deUint32	minFilter		= GL_NEAREST;
			deUint32	magFilter		= GL_NEAREST;
			int			numTextures		= texCounts[cntNdx];
			string		name			= string(texFormats[formatNdx].name) + "_" + de::toString(numTextures);
			string		description		= string(glu::getTextureFormatName(format)) + ", " + glu::getTypeName(dataType);

			addChild(new Texture2DRenderCase(m_context, name.c_str(), description.c_str(), format, dataType, wrapS, wrapT, minFilter, magFilter, tcu::Mat3(), numTextures, false /* npot */));
		}
	}
}